

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O1

int check_flag(char *flag,int argc,char **argv)

{
  int iVar1;
  char short_flag [3];
  int index;
  option long_options [2];
  undefined2 local_7f;
  char local_7d;
  undefined4 local_7c;
  char *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_7c = 0;
  local_7f = 0x3a2b;
  local_7d = *flag;
  _optind = 0;
  uStack_70 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = (ulong)(uint)(int)*flag;
  local_78 = flag;
  do {
    iVar1 = getopt_long(argc,argv,&local_7f,&local_78,&local_7c);
    if (iVar1 == *flag) {
      return 1;
    }
  } while (iVar1 != -1);
  return 0;
}

Assistant:

int check_flag(const char *flag, int argc, char *argv[]) {
	// For getopt long options
	int index = 0;
	// The char returned by getopt()
	int option;
	// Setting the first character to be a plus
	// prevents getopt() from reordering the vector,
	// setting the second character to be a colon
	// prevents getopt() from printing an error
	// message when it encounters invalid options
	char short_flag[3] = {'+', ':', flag[0]};

	// Reset getopt index
	optind = 0;

	// clang-format off
	struct option long_options [2] = {
		{flag, no_argument, NULL, flag[0]},
		{0,    0,           0,    0}
	};
	// clang-format on

	while (true) {
		option = getopt_long(argc, argv, short_flag, long_options, &index);

		if (option == flag[0]) {
			return true;
		} else if (option == -1) {
			break;
		}
	}

	return false;
}